

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_base_func.cpp
# Opt level: O0

uint32_t ivk::cmd_fopen(void *el)

{
  char *__filename;
  char *local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>
  local_98;
  undefined1 local_60 [8];
  proc_data dt;
  FILE *f;
  char *fn;
  char *md;
  char *hd;
  XMLElement *e;
  XMLElement **ep;
  void *el_local;
  
  hd = *el;
  e = (XMLElement *)el;
  ep = (XMLElement **)el;
  md = get_attr_val((XMLElement **)el,"handle");
  local_c8 = get_attr_val((XMLElement **)e,"mode");
  __filename = get_attr_val((XMLElement **)e,"file");
  if ((md == (char *)0x0) || (__filename == (char *)0x0)) {
    el_local._4_4_ = 5;
  }
  else {
    if (local_c8 == (char *)0x0) {
      local_c8 = "wr";
    }
    dt._16_8_ = fopen(__filename,local_c8);
    proc_data::proc_data((proc_data *)local_60,(char *)dt._16_8_,8,false);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>
    ::pair<const_char_*&,_ivk::proc_data_&,_true>(&local_98,&md,(proc_data *)local_60);
    std::
    map<std::__cxx11::string,ivk::proc_data,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ivk::proc_data>>>
    ::insert<std::pair<std::__cxx11::string,ivk::proc_data>>
              ((map<std::__cxx11::string,ivk::proc_data,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ivk::proc_data>>>
                *)gCmdMemMap_abi_cxx11_,&local_98);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>
    ::~pair(&local_98);
    el_local._4_4_ = 0;
    proc_data::~proc_data((proc_data *)local_60);
  }
  return el_local._4_4_;
}

Assistant:

uint32_t ivk::cmd_fopen(void* el){
    XMLElement** ep = (XMLElement**)el;
    XMLElement* e = *(XMLElement**)el;

    const char* hd = get_attr_val(ep,"handle");
    const char* md = get_attr_val(ep,"mode");
    const char* fn = get_attr_val(ep,"file");
    if(!hd || !fn){
        return proc_xml_err;
    }

    FILE* f = fopen(fn, md?md:"wr");
    proc_data dt((char*)f, sizeof(FILE*), false);
    gCmdMemMap.insert(pair<string,proc_data>(hd,dt));

    return proc_success;
}